

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.h
# Opt level: O2

void __thiscall
embree::sse2::BVHBuilderMorton::
BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::sse2::SetBVHNBounds<4>,_embree::sse2::CreateMortonLeaf<4,_embree::InstancePrimitive>,_embree::sse2::CalculateMeshBounds<embree::Instance>,_embree::Scene::BuildProgressMonitorInterface>
::recreateMortonCodes
          (BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::sse2::SetBVHNBounds<4>,_embree::sse2::CreateMortonLeaf<4,_embree::InstancePrimitive>,_embree::sse2::CalculateMeshBounds<embree::Instance>,_embree::Scene::BuildProgressMonitorInterface>
           *this,range<unsigned_int> *current)

{
  range<unsigned_int> rVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  Instance *pIVar3;
  AffineSpace3ff *pAVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  char cVar34;
  runtime_error *prVar35;
  size_t i;
  ulong uVar36;
  size_t i_1;
  ulong uVar37;
  uint uVar38;
  uint uVar40;
  undefined1 auVar39 [12];
  uint uVar41;
  float fVar42;
  float fVar47;
  float fVar48;
  undefined1 in_XMM1 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 in_XMM2 [16];
  float fVar52;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar72;
  float fVar73;
  undefined1 auVar67 [16];
  float fVar74;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar75;
  float fVar80;
  float fVar81;
  float fVar82;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar83 [12];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  task_group_context *in_stack_fffffffffffffe98;
  float local_138;
  float fStack_134;
  undefined1 local_128 [16];
  anon_class_8_1_8991fb9c calculateCentBounds;
  anon_class_8_1_898bcfc2 local_110;
  blocked_range<unsigned_int> local_108;
  MortonCodeMapping mapping;
  BBox3fa centBounds;
  task_group_context context;
  
  auVar51 = _DAT_01f45a40;
  auVar46 = _DAT_01f45a30;
  uVar38 = current->_begin;
  uVar37 = (ulong)uVar38;
  uVar40 = current->_end;
  if (uVar40 - uVar38 < 0x400) {
    auVar57 = _DAT_01f45a30;
    auVar58 = _DAT_01f45a40;
    for (uVar36 = uVar37; uVar36 < uVar40; uVar36 = uVar36 + 1) {
      pIVar3 = this->calculateBounds->mesh;
      pAVar4 = pIVar3->local2world;
      if ((pIVar3->super_Geometry).field_8.field_0x1 == '\x01') {
        fVar42 = (pAVar4->p).field_0.m128[3];
        fVar47 = (pAVar4->l).vx.field_0.m128[3];
        fVar48 = (pAVar4->l).vy.field_0.m128[3];
        fVar52 = (pAVar4->l).vz.field_0.m128[3];
        aVar2 = (pAVar4->l).vx.field_0.field_1;
        fVar93 = (pAVar4->l).vy.field_0.m128[0];
        fVar94 = (pAVar4->l).vy.field_0.m128[1];
        fVar65 = fVar47 * fVar48 + fVar42 * fVar52;
        fVar101 = fVar47 * fVar48 - fVar42 * fVar52;
        fVar103 = fVar42 * fVar42 + fVar47 * fVar47 + -fVar48 * fVar48 + -fVar52 * fVar52;
        fVar95 = fVar42 * fVar42 - fVar47 * fVar47;
        fVar64 = fVar48 * fVar48 + fVar95 + -fVar52 * fVar52;
        fVar63 = fVar47 * fVar52 - fVar42 * fVar48;
        fVar66 = fVar42 * fVar48 + fVar47 * fVar52;
        fVar99 = fVar48 * fVar52 + fVar42 * fVar47;
        fVar97 = fVar48 * fVar52 - fVar42 * fVar47;
        fVar61 = fVar52 * fVar52 + fVar95 + -fVar48 * fVar48;
        fVar42 = (pAVar4->l).vz.field_0.m128[0];
        fVar47 = (pAVar4->l).vz.field_0.m128[1];
        fVar48 = (pAVar4->l).vz.field_0.m128[2];
        fVar65 = fVar65 + fVar65;
        fVar63 = fVar63 + fVar63;
        fVar52 = (pAVar4->p).field_0.m128[0];
        fVar95 = (pAVar4->p).field_0.m128[1];
        fVar62 = (pAVar4->p).field_0.m128[2];
        fVar101 = fVar101 + fVar101;
        fVar99 = fVar99 + fVar99;
        fVar66 = fVar66 + fVar66;
        fVar97 = fVar97 + fVar97;
        fVar53 = fVar103 * 1.0 + fVar65 * 0.0 + fVar63 * 0.0;
        fVar54 = fVar103 * 0.0 + fVar65 * 1.0 + fVar63 * 0.0;
        fVar55 = fVar103 * 0.0 + fVar65 * 0.0 + fVar63 * 1.0;
        fVar56 = fVar103 * 0.0 + fVar65 * 0.0 + fVar63 * 0.0;
        fVar103 = fVar101 * 1.0 + fVar64 * 0.0 + fVar99 * 0.0;
        fVar96 = fVar101 * 0.0 + fVar64 * 1.0 + fVar99 * 0.0;
        fVar98 = fVar101 * 0.0 + fVar64 * 0.0 + fVar99 * 1.0;
        fVar100 = fVar101 * 0.0 + fVar64 * 0.0 + fVar99 * 0.0;
        fVar99 = fVar66 * 1.0 + fVar97 * 0.0 + fVar61 * 0.0;
        fVar82 = fVar66 * 0.0 + fVar97 * 1.0 + fVar61 * 0.0;
        fVar72 = fVar66 * 0.0 + fVar97 * 0.0 + fVar61 * 1.0;
        fVar66 = fVar66 * 0.0 + fVar97 * 0.0 + fVar61 * 0.0;
        fVar65 = aVar2.x;
        fVar61 = fVar65 * fVar53 + fVar103 * 0.0 + fVar99 * 0.0;
        fVar63 = fVar65 * fVar54 + fVar96 * 0.0 + fVar82 * 0.0;
        fVar64 = fVar65 * fVar55 + fVar98 * 0.0 + fVar72 * 0.0;
        fVar73 = fVar65 * fVar56 + fVar100 * 0.0 + fVar66 * 0.0;
        local_138 = aVar2.y;
        fStack_134 = aVar2.z;
        fVar65 = fVar93 * fVar53 + fVar94 * fVar103 + fVar99 * 0.0;
        fVar97 = fVar93 * fVar54 + fVar94 * fVar96 + fVar82 * 0.0;
        fVar101 = fVar93 * fVar55 + fVar94 * fVar98 + fVar72 * 0.0;
        fVar87 = fVar93 * fVar56 + fVar94 * fVar100 + fVar66 * 0.0;
        fVar88 = fVar42 * fVar53 + fVar47 * fVar103 + fVar48 * fVar99;
        fVar89 = fVar42 * fVar54 + fVar47 * fVar96 + fVar48 * fVar82;
        fVar91 = fVar42 * fVar55 + fVar47 * fVar98 + fVar48 * fVar72;
        fVar102 = fVar42 * fVar56 + fVar47 * fVar100 + fVar48 * fVar66;
        fVar93 = fVar52 * fVar53 + fVar95 * fVar103 + fVar62 * fVar99 + local_138 + 0.0;
        fVar94 = fVar52 * fVar54 + fVar95 * fVar96 + fVar62 * fVar82 + fStack_134 + 0.0;
        fVar99 = fVar52 * fVar55 + fVar95 * fVar98 + fVar62 * fVar72 +
                 (pAVar4->l).vy.field_0.m128[2] + 0.0;
        fVar52 = fVar52 * fVar56 + fVar95 * fVar100 + fVar62 * fVar66 + 0.0;
        lVar5 = *(long *)&(pIVar3->super_Geometry).field_0x58;
        auVar67 = minps(*(undefined1 (*) [16])(lVar5 + 0x10),*(undefined1 (*) [16])(lVar5 + 0x30));
        auVar43 = maxps(*(undefined1 (*) [16])(lVar5 + 0x20),*(undefined1 (*) [16])(lVar5 + 0x40));
        fVar96 = auVar67._0_4_;
        fVar53 = auVar67._4_4_;
        fVar42 = auVar67._8_4_;
        fVar100 = fVar42 * fVar88 + fVar93;
        fVar54 = fVar42 * fVar89 + fVar94;
        fVar55 = fVar42 * fVar91 + fVar99;
        fVar56 = fVar42 * fVar102 + fVar52;
        fVar75 = fVar53 * fVar65;
        fVar80 = fVar53 * fVar97;
        fVar81 = fVar53 * fVar101;
        fVar53 = fVar53 * fVar87;
        fVar66 = fVar75 + fVar100;
        fVar82 = fVar80 + fVar54;
        fVar72 = fVar81 + fVar55;
        fVar74 = fVar53 + fVar56;
        fVar95 = fVar96 * fVar61;
        fVar62 = fVar96 * fVar63;
        fVar103 = fVar96 * fVar64;
        fVar96 = fVar96 * fVar73;
        fVar42 = fVar95 + fVar66;
        fVar47 = fVar62 + fVar82;
        fVar48 = fVar103 + fVar72;
        fVar98 = fVar96 + fVar74;
        auVar16._4_4_ = fVar47;
        auVar16._0_4_ = fVar42;
        auVar16._8_4_ = fVar48;
        auVar16._12_4_ = fVar98;
        auVar67 = minps(_DAT_01f45a30,auVar16);
        auVar17._4_4_ = fVar47;
        auVar17._0_4_ = fVar42;
        auVar17._8_4_ = fVar48;
        auVar17._12_4_ = fVar98;
        auVar84 = maxps(_DAT_01f45a40,auVar17);
        fVar42 = auVar43._0_4_;
        fVar47 = auVar43._4_4_;
        fVar48 = auVar43._8_4_;
        fVar93 = fVar48 * fVar88 + fVar93;
        fVar94 = fVar48 * fVar89 + fVar94;
        fVar99 = fVar48 * fVar91 + fVar99;
        fVar52 = fVar48 * fVar102 + fVar52;
        fVar75 = fVar75 + fVar93;
        fVar80 = fVar80 + fVar94;
        fVar81 = fVar81 + fVar99;
        fVar53 = fVar53 + fVar52;
        auVar49._0_4_ = fVar95 + fVar75;
        auVar49._4_4_ = fVar62 + fVar80;
        auVar49._8_4_ = fVar103 + fVar81;
        auVar49._12_4_ = fVar96 + fVar53;
        auVar67 = minps(auVar67,auVar49);
        auVar43 = maxps(auVar84,auVar49);
        fVar65 = fVar47 * fVar65;
        fVar97 = fVar47 * fVar97;
        fVar101 = fVar47 * fVar101;
        fVar47 = fVar47 * fVar87;
        fVar100 = fVar100 + fVar65;
        fVar54 = fVar54 + fVar97;
        fVar55 = fVar55 + fVar101;
        fVar56 = fVar56 + fVar47;
        fVar48 = fVar95 + fVar100;
        fVar98 = fVar62 + fVar54;
        fVar87 = fVar103 + fVar55;
        fVar88 = fVar96 + fVar56;
        auVar24._4_4_ = fVar98;
        auVar24._0_4_ = fVar48;
        auVar24._8_4_ = fVar87;
        auVar24._12_4_ = fVar88;
        auVar67 = minps(auVar67,auVar24);
        auVar25._4_4_ = fVar98;
        auVar25._0_4_ = fVar48;
        auVar25._8_4_ = fVar87;
        auVar25._12_4_ = fVar88;
        auVar43 = maxps(auVar43,auVar25);
        fVar65 = fVar65 + fVar93;
        fVar97 = fVar97 + fVar94;
        fVar101 = fVar101 + fVar99;
        fVar47 = fVar47 + fVar52;
        fVar95 = fVar95 + fVar65;
        fVar62 = fVar62 + fVar97;
        fVar103 = fVar103 + fVar101;
        fVar96 = fVar96 + fVar47;
        auVar8._4_4_ = fVar62;
        auVar8._0_4_ = fVar95;
        auVar8._8_4_ = fVar103;
        auVar8._12_4_ = fVar96;
        auVar67 = minps(auVar67,auVar8);
        auVar9._4_4_ = fVar62;
        auVar9._0_4_ = fVar95;
        auVar9._8_4_ = fVar103;
        auVar9._12_4_ = fVar96;
        auVar43 = maxps(auVar43,auVar9);
        fVar61 = fVar42 * fVar61;
        fVar63 = fVar42 * fVar63;
        fVar64 = fVar42 * fVar64;
        fVar42 = fVar42 * fVar73;
        auVar77._0_4_ = fVar66 + fVar61;
        auVar77._4_4_ = fVar82 + fVar63;
        auVar77._8_4_ = fVar72 + fVar64;
        auVar77._12_4_ = fVar74 + fVar42;
        auVar67 = minps(auVar67,auVar77);
        auVar43 = maxps(auVar43,auVar77);
        fVar75 = fVar75 + fVar61;
        fVar80 = fVar80 + fVar63;
        fVar81 = fVar81 + fVar64;
        fVar53 = fVar53 + fVar42;
        auVar20._4_4_ = fVar80;
        auVar20._0_4_ = fVar75;
        auVar20._8_4_ = fVar81;
        auVar20._12_4_ = fVar53;
        auVar67 = minps(auVar67,auVar20);
        auVar21._4_4_ = fVar80;
        auVar21._0_4_ = fVar75;
        auVar21._8_4_ = fVar81;
        auVar21._12_4_ = fVar53;
        auVar43 = maxps(auVar43,auVar21);
        auVar69._0_4_ = fVar100 + fVar61;
        auVar69._4_4_ = fVar54 + fVar63;
        auVar69._8_4_ = fVar55 + fVar64;
        auVar69._12_4_ = fVar56 + fVar42;
        auVar67 = minps(auVar67,auVar69);
        auVar43 = maxps(auVar43,auVar69);
        in_XMM1._0_4_ = fVar61 + fVar65;
        in_XMM1._4_4_ = fVar63 + fVar97;
        in_XMM1._8_4_ = fVar64 + fVar101;
        in_XMM1._12_4_ = fVar42 + fVar47;
      }
      else {
        fVar42 = (pAVar4->l).vx.field_0.m128[0];
        fVar47 = (pAVar4->l).vx.field_0.m128[1];
        fVar48 = (pAVar4->l).vx.field_0.m128[2];
        fVar52 = (pAVar4->l).vx.field_0.m128[3];
        fVar93 = (pAVar4->l).vy.field_0.m128[0];
        fVar94 = (pAVar4->l).vy.field_0.m128[1];
        fVar95 = (pAVar4->l).vy.field_0.m128[2];
        fVar62 = (pAVar4->l).vy.field_0.m128[3];
        fVar61 = (pAVar4->l).vz.field_0.m128[0];
        fVar63 = (pAVar4->l).vz.field_0.m128[1];
        fVar64 = (pAVar4->l).vz.field_0.m128[2];
        fVar65 = (pAVar4->l).vz.field_0.m128[3];
        fVar97 = (pAVar4->p).field_0.m128[0];
        fVar99 = (pAVar4->p).field_0.m128[1];
        fVar101 = (pAVar4->p).field_0.m128[2];
        fVar103 = (pAVar4->p).field_0.m128[3];
        lVar5 = *(long *)&(pIVar3->super_Geometry).field_0x58;
        auVar67 = minps(*(undefined1 (*) [16])(lVar5 + 0x10),*(undefined1 (*) [16])(lVar5 + 0x30));
        auVar43 = maxps(*(undefined1 (*) [16])(lVar5 + 0x20),*(undefined1 (*) [16])(lVar5 + 0x40));
        fVar56 = auVar67._0_4_;
        fVar82 = auVar67._4_4_;
        fVar96 = auVar67._8_4_;
        fVar66 = fVar96 * fVar61 + fVar97;
        fVar72 = fVar96 * fVar63 + fVar99;
        fVar73 = fVar96 * fVar64 + fVar101;
        fVar74 = fVar96 * fVar65 + fVar103;
        fVar75 = fVar82 * fVar93;
        fVar80 = fVar82 * fVar94;
        fVar81 = fVar82 * fVar95;
        fVar82 = fVar82 * fVar62;
        fVar87 = fVar75 + fVar66;
        fVar88 = fVar80 + fVar72;
        fVar89 = fVar81 + fVar73;
        fVar91 = fVar82 + fVar74;
        fVar53 = fVar56 * fVar42;
        fVar54 = fVar56 * fVar47;
        fVar55 = fVar56 * fVar48;
        fVar56 = fVar56 * fVar52;
        fVar96 = fVar53 + fVar87;
        fVar98 = fVar54 + fVar88;
        fVar100 = fVar55 + fVar89;
        fVar102 = fVar56 + fVar91;
        auVar30._4_4_ = fVar98;
        auVar30._0_4_ = fVar96;
        auVar30._8_4_ = fVar100;
        auVar30._12_4_ = fVar102;
        auVar67 = minps(_DAT_01f45a30,auVar30);
        auVar31._4_4_ = fVar98;
        auVar31._0_4_ = fVar96;
        auVar31._8_4_ = fVar100;
        auVar31._12_4_ = fVar102;
        auVar84 = maxps(_DAT_01f45a40,auVar31);
        fVar96 = auVar43._0_4_;
        fVar98 = auVar43._4_4_;
        fVar100 = auVar43._8_4_;
        fVar97 = fVar100 * fVar61 + fVar97;
        fVar99 = fVar100 * fVar63 + fVar99;
        fVar101 = fVar100 * fVar64 + fVar101;
        fVar103 = fVar100 * fVar65 + fVar103;
        fVar75 = fVar75 + fVar97;
        fVar80 = fVar80 + fVar99;
        fVar81 = fVar81 + fVar101;
        fVar82 = fVar82 + fVar103;
        fVar61 = fVar53 + fVar75;
        fVar63 = fVar54 + fVar80;
        fVar64 = fVar55 + fVar81;
        fVar65 = fVar56 + fVar82;
        auVar12._4_4_ = fVar63;
        auVar12._0_4_ = fVar61;
        auVar12._8_4_ = fVar64;
        auVar12._12_4_ = fVar65;
        auVar67 = minps(auVar67,auVar12);
        auVar13._4_4_ = fVar63;
        auVar13._0_4_ = fVar61;
        auVar13._8_4_ = fVar64;
        auVar13._12_4_ = fVar65;
        auVar43 = maxps(auVar84,auVar13);
        fVar93 = fVar98 * fVar93;
        fVar94 = fVar98 * fVar94;
        fVar95 = fVar98 * fVar95;
        fVar98 = fVar98 * fVar62;
        fVar66 = fVar66 + fVar93;
        fVar72 = fVar72 + fVar94;
        fVar73 = fVar73 + fVar95;
        fVar74 = fVar74 + fVar98;
        fVar62 = fVar53 + fVar66;
        fVar61 = fVar54 + fVar72;
        fVar63 = fVar55 + fVar73;
        fVar64 = fVar56 + fVar74;
        auVar14._4_4_ = fVar61;
        auVar14._0_4_ = fVar62;
        auVar14._8_4_ = fVar63;
        auVar14._12_4_ = fVar64;
        auVar67 = minps(auVar67,auVar14);
        auVar15._4_4_ = fVar61;
        auVar15._0_4_ = fVar62;
        auVar15._8_4_ = fVar63;
        auVar15._12_4_ = fVar64;
        auVar43 = maxps(auVar43,auVar15);
        fVar93 = fVar93 + fVar97;
        fVar94 = fVar94 + fVar99;
        fVar95 = fVar95 + fVar101;
        fVar98 = fVar98 + fVar103;
        fVar53 = fVar53 + fVar93;
        fVar54 = fVar54 + fVar94;
        fVar55 = fVar55 + fVar95;
        fVar56 = fVar56 + fVar98;
        auVar6._4_4_ = fVar54;
        auVar6._0_4_ = fVar53;
        auVar6._8_4_ = fVar55;
        auVar6._12_4_ = fVar56;
        auVar67 = minps(auVar67,auVar6);
        auVar7._4_4_ = fVar54;
        auVar7._0_4_ = fVar53;
        auVar7._8_4_ = fVar55;
        auVar7._12_4_ = fVar56;
        auVar43 = maxps(auVar43,auVar7);
        fVar42 = fVar96 * fVar42;
        fVar47 = fVar96 * fVar47;
        fVar48 = fVar96 * fVar48;
        fVar96 = fVar96 * fVar52;
        fVar87 = fVar87 + fVar42;
        fVar88 = fVar88 + fVar47;
        fVar89 = fVar89 + fVar48;
        fVar91 = fVar91 + fVar96;
        auVar18._4_4_ = fVar88;
        auVar18._0_4_ = fVar87;
        auVar18._8_4_ = fVar89;
        auVar18._12_4_ = fVar91;
        auVar67 = minps(auVar67,auVar18);
        auVar19._4_4_ = fVar88;
        auVar19._0_4_ = fVar87;
        auVar19._8_4_ = fVar89;
        auVar19._12_4_ = fVar91;
        auVar43 = maxps(auVar43,auVar19);
        auVar76._0_4_ = fVar75 + fVar42;
        auVar76._4_4_ = fVar80 + fVar47;
        auVar76._8_4_ = fVar81 + fVar48;
        auVar76._12_4_ = fVar82 + fVar96;
        auVar67 = minps(auVar67,auVar76);
        auVar43 = maxps(auVar43,auVar76);
        auVar68._0_4_ = fVar66 + fVar42;
        auVar68._4_4_ = fVar72 + fVar47;
        auVar68._8_4_ = fVar73 + fVar48;
        auVar68._12_4_ = fVar74 + fVar96;
        auVar67 = minps(auVar67,auVar68);
        auVar43 = maxps(auVar43,auVar68);
        in_XMM1._0_4_ = fVar42 + fVar93;
        in_XMM1._4_4_ = fVar47 + fVar94;
        in_XMM1._8_4_ = fVar48 + fVar95;
        in_XMM1._12_4_ = fVar96 + fVar98;
      }
      auVar67 = minps(auVar67,in_XMM1);
      auVar43 = maxps(auVar43,in_XMM1);
      auVar85._0_4_ = auVar43._0_4_ + auVar67._0_4_;
      auVar85._4_4_ = auVar43._4_4_ + auVar67._4_4_;
      auVar85._8_4_ = auVar43._8_4_ + auVar67._8_4_;
      auVar85._12_4_ = auVar43._12_4_ + auVar67._12_4_;
      auVar57 = minps(auVar57,auVar85);
      auVar58 = maxps(auVar58,auVar85);
    }
    auVar67._0_4_ = auVar58._0_4_ - auVar57._0_4_;
    auVar67._4_4_ = auVar58._4_4_ - auVar57._4_4_;
    auVar67._8_4_ = auVar58._8_4_ - auVar57._8_4_;
    auVar67._12_4_ = auVar58._12_4_ - auVar57._12_4_;
    auVar58 = rcpps(in_XMM1,auVar67);
    fVar42 = auVar58._0_4_;
    fVar47 = auVar58._4_4_;
    fVar48 = auVar58._8_4_;
    for (; uVar37 < current->_end; uVar37 = uVar37 + 1) {
      pIVar3 = this->calculateBounds->mesh;
      pAVar4 = pIVar3->local2world;
      if ((pIVar3->super_Geometry).field_8.field_0x1 == '\x01') {
        fVar52 = (pAVar4->p).field_0.m128[3];
        fVar93 = (pAVar4->l).vx.field_0.m128[3];
        fVar94 = (pAVar4->l).vy.field_0.m128[3];
        fVar95 = (pAVar4->l).vz.field_0.m128[3];
        aVar2 = (pAVar4->l).vx.field_0.field_1;
        fVar62 = (pAVar4->l).vy.field_0.m128[0];
        fVar61 = (pAVar4->l).vy.field_0.m128[1];
        fVar96 = fVar93 * fVar94 + fVar52 * fVar95;
        fVar101 = fVar93 * fVar94 - fVar52 * fVar95;
        fVar98 = fVar52 * fVar52 + fVar93 * fVar93 + -fVar94 * fVar94 + -fVar95 * fVar95;
        fVar63 = fVar52 * fVar52 - fVar93 * fVar93;
        fVar99 = fVar94 * fVar94 + fVar63 + -fVar95 * fVar95;
        fVar103 = fVar93 * fVar95 - fVar52 * fVar94;
        fVar66 = fVar52 * fVar94 + fVar93 * fVar95;
        fVar100 = fVar94 * fVar95 + fVar52 * fVar93;
        fVar65 = fVar94 * fVar95 - fVar52 * fVar93;
        fVar97 = fVar95 * fVar95 + fVar63 + -fVar94 * fVar94;
        fVar52 = (pAVar4->l).vz.field_0.m128[0];
        fVar93 = (pAVar4->l).vz.field_0.m128[1];
        fVar94 = (pAVar4->l).vz.field_0.m128[2];
        fVar96 = fVar96 + fVar96;
        fVar103 = fVar103 + fVar103;
        fVar95 = (pAVar4->p).field_0.m128[0];
        fVar63 = (pAVar4->p).field_0.m128[1];
        fVar64 = (pAVar4->p).field_0.m128[2];
        fVar101 = fVar101 + fVar101;
        fVar100 = fVar100 + fVar100;
        fVar66 = fVar66 + fVar66;
        fVar65 = fVar65 + fVar65;
        fVar53 = fVar98 * 1.0 + fVar96 * 0.0 + fVar103 * 0.0;
        fVar54 = fVar98 * 0.0 + fVar96 * 1.0 + fVar103 * 0.0;
        fVar55 = fVar98 * 0.0 + fVar96 * 0.0 + fVar103 * 1.0;
        fVar56 = fVar98 * 0.0 + fVar96 * 0.0 + fVar103 * 0.0;
        fVar103 = fVar101 * 1.0 + fVar99 * 0.0 + fVar100 * 0.0;
        fVar96 = fVar101 * 0.0 + fVar99 * 1.0 + fVar100 * 0.0;
        fVar98 = fVar101 * 0.0 + fVar99 * 0.0 + fVar100 * 1.0;
        fVar100 = fVar101 * 0.0 + fVar99 * 0.0 + fVar100 * 0.0;
        fVar73 = fVar66 * 1.0 + fVar65 * 0.0 + fVar97 * 0.0;
        fVar75 = fVar66 * 0.0 + fVar65 * 1.0 + fVar97 * 0.0;
        fVar80 = fVar66 * 0.0 + fVar65 * 0.0 + fVar97 * 1.0;
        fVar66 = fVar66 * 0.0 + fVar65 * 0.0 + fVar97 * 0.0;
        fVar65 = aVar2.x;
        fVar82 = fVar65 * fVar53 + fVar103 * 0.0 + fVar73 * 0.0;
        fVar72 = fVar65 * fVar54 + fVar96 * 0.0 + fVar75 * 0.0;
        fVar74 = fVar65 * fVar55 + fVar98 * 0.0 + fVar80 * 0.0;
        fVar88 = fVar65 * fVar56 + fVar100 * 0.0 + fVar66 * 0.0;
        local_138 = aVar2.y;
        fStack_134 = aVar2.z;
        fVar65 = fVar62 * fVar53 + fVar61 * fVar103 + fVar73 * 0.0;
        fVar97 = fVar62 * fVar54 + fVar61 * fVar96 + fVar75 * 0.0;
        fVar101 = fVar62 * fVar55 + fVar61 * fVar98 + fVar80 * 0.0;
        fVar92 = fVar62 * fVar56 + fVar61 * fVar100 + fVar66 * 0.0;
        fVar62 = fVar52 * fVar53 + fVar93 * fVar103 + fVar94 * fVar73;
        fVar61 = fVar52 * fVar54 + fVar93 * fVar96 + fVar94 * fVar75;
        fVar99 = fVar52 * fVar55 + fVar93 * fVar98 + fVar94 * fVar80;
        fVar52 = fVar52 * fVar56 + fVar93 * fVar100 + fVar94 * fVar66;
        fVar53 = fVar95 * fVar53 + fVar63 * fVar103 + fVar64 * fVar73 + local_138 + 0.0;
        fVar54 = fVar95 * fVar54 + fVar63 * fVar96 + fVar64 * fVar75 + fStack_134 + 0.0;
        fVar55 = fVar95 * fVar55 + fVar63 * fVar98 + fVar64 * fVar80 +
                 (pAVar4->l).vy.field_0.m128[2] + 0.0;
        fVar56 = fVar95 * fVar56 + fVar63 * fVar100 + fVar64 * fVar66 + 0.0;
        lVar5 = *(long *)&(pIVar3->super_Geometry).field_0x58;
        auVar58 = minps(*(undefined1 (*) [16])(lVar5 + 0x10),*(undefined1 (*) [16])(lVar5 + 0x30));
        auVar43 = maxps(*(undefined1 (*) [16])(lVar5 + 0x20),*(undefined1 (*) [16])(lVar5 + 0x40));
        fVar100 = auVar58._0_4_;
        fVar64 = auVar58._4_4_;
        fVar93 = auVar58._8_4_;
        fVar75 = fVar93 * fVar62 + fVar53;
        fVar80 = fVar93 * fVar61 + fVar54;
        fVar81 = fVar93 * fVar99 + fVar55;
        fVar87 = fVar93 * fVar52 + fVar56;
        fVar94 = fVar64 * fVar65;
        fVar95 = fVar64 * fVar97;
        fVar63 = fVar64 * fVar101;
        fVar64 = fVar64 * fVar92;
        fVar89 = fVar94 + fVar75;
        fVar91 = fVar95 + fVar80;
        fVar102 = fVar63 + fVar81;
        fVar90 = fVar64 + fVar87;
        fVar103 = fVar100 * fVar82;
        fVar96 = fVar100 * fVar72;
        fVar98 = fVar100 * fVar74;
        fVar100 = fVar100 * fVar88;
        auVar60._0_4_ = fVar103 + fVar89;
        auVar60._4_4_ = fVar96 + fVar91;
        auVar60._8_4_ = fVar98 + fVar102;
        auVar60._12_4_ = fVar100 + fVar90;
        auVar84 = minps(auVar46,auVar60);
        auVar58 = maxps(auVar51,auVar60);
        fVar66 = auVar43._0_4_;
        fVar93 = auVar43._4_4_;
        fVar73 = auVar43._8_4_;
        fVar53 = fVar73 * fVar62 + fVar53;
        fVar54 = fVar73 * fVar61 + fVar54;
        fVar55 = fVar73 * fVar99 + fVar55;
        fVar56 = fVar73 * fVar52 + fVar56;
        fVar94 = fVar94 + fVar53;
        fVar95 = fVar95 + fVar54;
        fVar63 = fVar63 + fVar55;
        fVar64 = fVar64 + fVar56;
        auVar45._0_4_ = fVar103 + fVar94;
        auVar45._4_4_ = fVar96 + fVar95;
        auVar45._8_4_ = fVar98 + fVar63;
        auVar45._12_4_ = fVar100 + fVar64;
        auVar43 = minps(auVar84,auVar45);
        auVar58 = maxps(auVar58,auVar45);
        fVar65 = fVar93 * fVar65;
        fVar97 = fVar93 * fVar97;
        fVar101 = fVar93 * fVar101;
        fVar93 = fVar93 * fVar92;
        fVar75 = fVar75 + fVar65;
        fVar80 = fVar80 + fVar97;
        fVar81 = fVar81 + fVar101;
        fVar87 = fVar87 + fVar93;
        fVar52 = fVar103 + fVar75;
        fVar62 = fVar96 + fVar80;
        fVar61 = fVar98 + fVar81;
        fVar99 = fVar100 + fVar87;
        auVar28._4_4_ = fVar62;
        auVar28._0_4_ = fVar52;
        auVar28._8_4_ = fVar61;
        auVar28._12_4_ = fVar99;
        auVar43 = minps(auVar43,auVar28);
        auVar29._4_4_ = fVar62;
        auVar29._0_4_ = fVar52;
        auVar29._8_4_ = fVar61;
        auVar29._12_4_ = fVar99;
        auVar84 = maxps(auVar58,auVar29);
        fVar65 = fVar65 + fVar53;
        fVar97 = fVar97 + fVar54;
        fVar101 = fVar101 + fVar55;
        fVar93 = fVar93 + fVar56;
        fVar103 = fVar103 + fVar65;
        fVar96 = fVar96 + fVar97;
        fVar98 = fVar98 + fVar101;
        fVar100 = fVar100 + fVar93;
        auVar58._4_4_ = fVar96;
        auVar58._0_4_ = fVar103;
        auVar58._8_4_ = fVar98;
        auVar58._12_4_ = fVar100;
        auVar86 = minps(auVar43,auVar58);
        auVar43._4_4_ = fVar96;
        auVar43._0_4_ = fVar103;
        auVar43._8_4_ = fVar98;
        auVar43._12_4_ = fVar100;
        auVar58 = maxps(auVar84,auVar43);
        fVar82 = fVar66 * fVar82;
        fVar72 = fVar66 * fVar72;
        fVar74 = fVar66 * fVar74;
        fVar66 = fVar66 * fVar88;
        fVar89 = fVar89 + fVar82;
        fVar91 = fVar91 + fVar72;
        fVar102 = fVar102 + fVar74;
        fVar90 = fVar90 + fVar66;
        auVar84._4_4_ = fVar91;
        auVar84._0_4_ = fVar89;
        auVar84._8_4_ = fVar102;
        auVar84._12_4_ = fVar90;
        auVar43 = minps(auVar86,auVar84);
        auVar86._4_4_ = fVar91;
        auVar86._0_4_ = fVar89;
        auVar86._8_4_ = fVar102;
        auVar86._12_4_ = fVar90;
        auVar58 = maxps(auVar58,auVar86);
        auVar50._0_4_ = fVar94 + fVar82;
        auVar50._4_4_ = fVar95 + fVar72;
        auVar50._8_4_ = fVar63 + fVar74;
        auVar50._12_4_ = fVar64 + fVar66;
        auVar43 = minps(auVar43,auVar50);
        auVar58 = maxps(auVar58,auVar50);
        auVar79._0_4_ = fVar75 + fVar82;
        auVar79._4_4_ = fVar80 + fVar72;
        auVar79._8_4_ = fVar81 + fVar74;
        auVar79._12_4_ = fVar87 + fVar66;
        auVar43 = minps(auVar43,auVar79);
        auVar58 = maxps(auVar58,auVar79);
        auVar71._0_4_ = fVar82 + fVar65;
        auVar71._4_4_ = fVar72 + fVar97;
        auVar71._8_4_ = fVar74 + fVar101;
        auVar71._12_4_ = fVar66 + fVar93;
        auVar43 = minps(auVar43,auVar71);
        auVar83 = auVar43._0_12_;
        auVar58 = maxps(auVar58,auVar71);
        auVar39 = auVar58._0_12_;
      }
      else {
        fVar52 = (pAVar4->l).vx.field_0.m128[0];
        fVar93 = (pAVar4->l).vx.field_0.m128[1];
        fVar94 = (pAVar4->l).vx.field_0.m128[2];
        fVar95 = (pAVar4->l).vx.field_0.m128[3];
        fVar62 = (pAVar4->l).vy.field_0.m128[0];
        fVar61 = (pAVar4->l).vy.field_0.m128[1];
        fVar63 = (pAVar4->l).vy.field_0.m128[2];
        fVar64 = (pAVar4->l).vy.field_0.m128[3];
        fVar65 = (pAVar4->l).vz.field_0.m128[0];
        fVar97 = (pAVar4->l).vz.field_0.m128[1];
        fVar99 = (pAVar4->l).vz.field_0.m128[2];
        fVar101 = (pAVar4->l).vz.field_0.m128[3];
        fVar103 = (pAVar4->p).field_0.m128[0];
        fVar96 = (pAVar4->p).field_0.m128[1];
        fVar98 = (pAVar4->p).field_0.m128[2];
        fVar100 = (pAVar4->p).field_0.m128[3];
        lVar5 = *(long *)&(pIVar3->super_Geometry).field_0x58;
        auVar58 = minps(*(undefined1 (*) [16])(lVar5 + 0x10),*(undefined1 (*) [16])(lVar5 + 0x30));
        auVar43 = maxps(*(undefined1 (*) [16])(lVar5 + 0x20),*(undefined1 (*) [16])(lVar5 + 0x40));
        fVar72 = auVar58._0_4_;
        fVar74 = auVar58._4_4_;
        fVar53 = auVar58._8_4_;
        fVar73 = fVar53 * fVar65 + fVar103;
        fVar75 = fVar53 * fVar97 + fVar96;
        fVar80 = fVar53 * fVar99 + fVar98;
        fVar81 = fVar53 * fVar101 + fVar100;
        fVar87 = fVar74 * fVar62;
        fVar88 = fVar74 * fVar61;
        fVar89 = fVar74 * fVar63;
        fVar74 = fVar74 * fVar64;
        fVar91 = fVar87 + fVar73;
        fVar102 = fVar88 + fVar75;
        fVar90 = fVar89 + fVar80;
        fVar92 = fVar74 + fVar81;
        fVar56 = fVar72 * fVar52;
        fVar66 = fVar72 * fVar93;
        fVar82 = fVar72 * fVar94;
        fVar72 = fVar72 * fVar95;
        fVar53 = fVar56 + fVar91;
        fVar54 = fVar66 + fVar102;
        fVar55 = fVar82 + fVar90;
        fVar104 = fVar72 + fVar92;
        auVar32._4_4_ = fVar54;
        auVar32._0_4_ = fVar53;
        auVar32._8_4_ = fVar55;
        auVar32._12_4_ = fVar104;
        auVar84 = minps(auVar46,auVar32);
        auVar33._4_4_ = fVar54;
        auVar33._0_4_ = fVar53;
        auVar33._8_4_ = fVar55;
        auVar33._12_4_ = fVar104;
        auVar58 = maxps(auVar51,auVar33);
        fVar53 = auVar43._0_4_;
        fVar54 = auVar43._4_4_;
        fVar55 = auVar43._8_4_;
        fVar103 = fVar55 * fVar65 + fVar103;
        fVar96 = fVar55 * fVar97 + fVar96;
        fVar98 = fVar55 * fVar99 + fVar98;
        fVar100 = fVar55 * fVar101 + fVar100;
        fVar87 = fVar87 + fVar103;
        fVar88 = fVar88 + fVar96;
        fVar89 = fVar89 + fVar98;
        fVar74 = fVar74 + fVar100;
        fVar65 = fVar56 + fVar87;
        fVar97 = fVar66 + fVar88;
        fVar99 = fVar82 + fVar89;
        fVar101 = fVar72 + fVar74;
        auVar26._4_4_ = fVar97;
        auVar26._0_4_ = fVar65;
        auVar26._8_4_ = fVar99;
        auVar26._12_4_ = fVar101;
        auVar43 = minps(auVar84,auVar26);
        auVar27._4_4_ = fVar97;
        auVar27._0_4_ = fVar65;
        auVar27._8_4_ = fVar99;
        auVar27._12_4_ = fVar101;
        auVar58 = maxps(auVar58,auVar27);
        fVar62 = fVar54 * fVar62;
        fVar61 = fVar54 * fVar61;
        fVar63 = fVar54 * fVar63;
        fVar54 = fVar54 * fVar64;
        fVar73 = fVar73 + fVar62;
        fVar75 = fVar75 + fVar61;
        fVar80 = fVar80 + fVar63;
        fVar81 = fVar81 + fVar54;
        auVar59._0_4_ = fVar56 + fVar73;
        auVar59._4_4_ = fVar66 + fVar75;
        auVar59._8_4_ = fVar82 + fVar80;
        auVar59._12_4_ = fVar72 + fVar81;
        auVar43 = minps(auVar43,auVar59);
        auVar58 = maxps(auVar58,auVar59);
        fVar62 = fVar62 + fVar103;
        fVar61 = fVar61 + fVar96;
        fVar63 = fVar63 + fVar98;
        fVar54 = fVar54 + fVar100;
        fVar56 = fVar56 + fVar62;
        fVar66 = fVar66 + fVar61;
        fVar82 = fVar82 + fVar63;
        fVar72 = fVar72 + fVar54;
        auVar10._4_4_ = fVar66;
        auVar10._0_4_ = fVar56;
        auVar10._8_4_ = fVar82;
        auVar10._12_4_ = fVar72;
        auVar43 = minps(auVar43,auVar10);
        auVar11._4_4_ = fVar66;
        auVar11._0_4_ = fVar56;
        auVar11._8_4_ = fVar82;
        auVar11._12_4_ = fVar72;
        auVar58 = maxps(auVar58,auVar11);
        fVar52 = fVar53 * fVar52;
        fVar93 = fVar53 * fVar93;
        fVar94 = fVar53 * fVar94;
        fVar53 = fVar53 * fVar95;
        fVar91 = fVar91 + fVar52;
        fVar102 = fVar102 + fVar93;
        fVar90 = fVar90 + fVar94;
        fVar92 = fVar92 + fVar53;
        auVar22._4_4_ = fVar102;
        auVar22._0_4_ = fVar91;
        auVar22._8_4_ = fVar90;
        auVar22._12_4_ = fVar92;
        auVar43 = minps(auVar43,auVar22);
        auVar23._4_4_ = fVar102;
        auVar23._0_4_ = fVar91;
        auVar23._8_4_ = fVar90;
        auVar23._12_4_ = fVar92;
        auVar58 = maxps(auVar58,auVar23);
        auVar78._0_4_ = fVar87 + fVar52;
        auVar78._4_4_ = fVar88 + fVar93;
        auVar78._8_4_ = fVar89 + fVar94;
        auVar78._12_4_ = fVar74 + fVar53;
        auVar43 = minps(auVar43,auVar78);
        auVar58 = maxps(auVar58,auVar78);
        auVar70._0_4_ = fVar73 + fVar52;
        auVar70._4_4_ = fVar75 + fVar93;
        auVar70._8_4_ = fVar80 + fVar94;
        auVar70._12_4_ = fVar81 + fVar53;
        auVar43 = minps(auVar43,auVar70);
        auVar58 = maxps(auVar58,auVar70);
        auVar44._0_4_ = fVar52 + fVar62;
        auVar44._4_4_ = fVar93 + fVar61;
        auVar44._8_4_ = fVar94 + fVar63;
        auVar44._12_4_ = fVar53 + fVar54;
        auVar43 = minps(auVar43,auVar44);
        auVar83 = auVar43._0_12_;
        auVar58 = maxps(auVar58,auVar44);
        auVar39 = auVar58._0_12_;
      }
      uVar38 = (uint)(((auVar39._0_4_ + auVar83._0_4_) - auVar57._0_4_) *
                     (float)((uint)(((1.0 - auVar67._0_4_ * fVar42) * fVar42 + fVar42) * 1013.76) &
                            -(uint)(1e-19 < auVar67._0_4_)));
      uVar40 = (uint)(((auVar39._4_4_ + auVar83._4_4_) - auVar57._4_4_) *
                     (float)((uint)(((1.0 - auVar67._4_4_ * fVar47) * fVar47 + fVar47) * 1013.76) &
                            -(uint)(1e-19 < auVar67._4_4_)));
      uVar41 = (uint)(((auVar39._8_4_ + auVar83._8_4_) - auVar57._8_4_) *
                     (float)((uint)(((1.0 - auVar67._8_4_ * fVar48) * fVar48 + fVar48) * 1013.76) &
                            -(uint)(1e-19 < auVar67._8_4_)));
      this->morton[uVar37].field_0.field_0.code =
           ((((uVar41 << 0x10 | uVar41) & 0x30000ff) * 0x101 & 0x300f00f) * 0x11 & 0x30c30c3) * 0x14
           & 0x24924924 |
           ((((uVar40 << 0x10 | uVar40) & 0x30000ff) * 0x101 & 0x300f00f) * 0x11 & 0x30c30c3) * 10 &
           0x12492492 |
           ((((uVar38 << 0x10 | uVar38) & 0x30000ff) * 0x101 & 0x300f00f) * 0x11 & 0x30c30c3) * 5 &
           0x9249249;
    }
    std::__sort<embree::sse2::BVHBuilderMorton::BuildPrim*,__gnu_cxx::__ops::_Iter_less_iter>
              (this->morton + current->_begin,this->morton + current->_end);
    return;
  }
  mapping.base.field_0._0_8_ = 0x7f8000007f800000;
  mapping.base.field_0._8_8_ = 0x7f8000007f800000;
  mapping.scale.field_0._0_8_ = 0xff800000ff800000;
  mapping.scale.field_0._8_8_ = 0xff800000ff800000;
  calculateCentBounds.this =
       (BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::sse2::SetBVHNBounds<4>,_embree::sse2::CreateMortonLeaf<4,_embree::TriangleM<4>_>,_embree::sse2::CalculateMeshBounds<embree::TriangleMesh>,_embree::Scene::BuildProgressMonitorInterface>
        *)this;
  tbb::detail::d1::task_group_context::task_group_context(&context,(context_traits)0x4,CUSTOM_CTX);
  local_108.my_begin = uVar38;
  local_108.my_end = uVar40;
  local_108.my_grainsize = 0x400;
  local_128._0_8_ = BBox<embree::Vec3fa>::merge;
  local_128._8_8_ = &calculateCentBounds;
  tbb::detail::d1::
  parallel_reduce<tbb::detail::d1::blocked_range<unsigned_int>,embree::BBox<embree::Vec3fa>,embree::parallel_reduce<unsigned_int,embree::BBox<embree::Vec3fa>,embree::sse2::BVHBuilderMorton::BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>>,embree::FastAllocator::CachedAllocator,embree::BVHN<4>::CreateAlloc,embree::AABBNode_t<embree::NodeRefPtr<4>,4>::Create,embree::sse2::SetBVHNBounds<4>,embree::sse2::CreateMortonLeaf<4,embree::InstancePrimitive>,embree::sse2::CalculateMeshBounds<embree::Instance>,embree::Scene::BuildProgressMonitorInterface>::recreateMortonCodes(embree::range<unsigned_int>const&)const::_lambda(embree::range<unsigned_int>const&)_1_,embree::BBox<embree::Vec3fa>const(embree::BBox<embree::Vec3fa>const&,embree::BBox<embree::Vec3fa>const&)>(unsigned_int,unsigned_int,unsigned_int,embree::BBox<embree::Vec3fa>const&,embree::sse2::BVHBuilderMorton::BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>>,embree::FastAllocator::CachedAllocator,embree::BVHN<4>::CreateAlloc,embree::AABBNode_t<embree::NodeRefPtr<4>,4>::Create,embree::sse2::SetBVHNBounds<4>,embree::sse2::CreateMortonLeaf<4,embree::InstancePrimitive>,embree::sse2::CalculateMeshBounds<embree::Instance>,embree::Scene::BuildProgressMonitorInterface>::recreateMortonCodes(embree::range<unsigned_int>const&)const::_lambda(embree::range<unsigned_int>const&)_1_const&,embree::BBox<embree::Vec3fa>const(const&)(embree::BBox<embree::Vec3fa>const&,embree::BBox<embree::Vec3fa>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_int>const&,embree::BBox<embree::Vec3fa>const&)_1_,embree::BBox<embree::Vec3fa>const(embree::BBox<embree::Vec3fa>const&,embree::BBox<embree::Vec3fa>const&)>
            (&centBounds,(d1 *)&local_108,(blocked_range<unsigned_int> *)&mapping,
             (BBox<embree::Vec3fa> *)local_128,
             (anon_class_16_2_ed117de8_conflict24 *)BBox<embree::Vec3fa>::merge,
             (_func_BBox<embree::Vec3fa>_BBox<embree::Vec3fa>_ptr_BBox<embree::Vec3fa>_ptr *)
             &context,in_stack_fffffffffffffe98);
  cVar34 = tbb::detail::r1::is_group_execution_cancelled(&context);
  if (cVar34 == '\0') {
    tbb::detail::d1::task_group_context::~task_group_context(&context);
    auVar46._0_4_ = centBounds.upper.field_0.m128[0] - centBounds.lower.field_0.m128[0];
    auVar46._4_4_ = centBounds.upper.field_0.m128[1] - centBounds.lower.field_0.m128[1];
    auVar46._8_4_ = centBounds.upper.field_0.m128[2] - centBounds.lower.field_0.m128[2];
    auVar46._12_4_ = centBounds.upper.field_0.m128[3] - centBounds.lower.field_0.m128[3];
    auVar51 = rcpps(in_XMM2,auVar46);
    fVar42 = auVar51._0_4_;
    fVar47 = auVar51._4_4_;
    fVar48 = auVar51._8_4_;
    fVar52 = auVar51._12_4_;
    mapping.scale.field_0.i[1] =
         (uint)(((1.0 - auVar46._4_4_ * fVar47) * fVar47 + fVar47) * 1013.76) &
         -(uint)(1e-19 < auVar46._4_4_);
    mapping.scale.field_0.i[0] =
         (uint)(((1.0 - auVar46._0_4_ * fVar42) * fVar42 + fVar42) * 1013.76) &
         -(uint)(1e-19 < auVar46._0_4_);
    mapping.scale.field_0.i[3] =
         (uint)(((1.0 - auVar46._12_4_ * fVar52) * fVar52 + fVar52) * 1013.76) &
         -(uint)(1e-19 < auVar46._12_4_);
    mapping.scale.field_0.i[2] =
         (uint)(((1.0 - auVar46._8_4_ * fVar48) * fVar48 + fVar48) * 1013.76) &
         -(uint)(1e-19 < auVar46._8_4_);
    rVar1 = *current;
    local_128._0_8_ = this;
    local_128._8_8_ = &mapping;
    tbb::detail::d1::task_group_context::task_group_context(&context,(context_traits)0x4,CUSTOM_CTX)
    ;
    local_108.my_begin = rVar1._begin;
    local_108.my_end = rVar1._end;
    local_108.my_grainsize = 0x400;
    local_110.func = (anon_class_16_2_00173b7b *)local_128;
    tbb::detail::d1::
    parallel_for<tbb::detail::d1::blocked_range<unsigned_int>,embree::parallel_for<unsigned_int,embree::sse2::BVHBuilderMorton::BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>>,embree::FastAllocator::CachedAllocator,embree::BVHN<4>::CreateAlloc,embree::AABBNode_t<embree::NodeRefPtr<4>,4>::Create,embree::sse2::SetBVHNBounds<4>,embree::sse2::CreateMortonLeaf<4,embree::InstancePrimitive>,embree::sse2::CalculateMeshBounds<embree::Instance>,embree::Scene::BuildProgressMonitorInterface>::recreateMortonCodes(embree::range<unsigned_int>const&)const::_lambda(embree::range<unsigned_int>const&)_2_>(unsigned_int,unsigned_int,unsigned_int,embree::sse2::BVHBuilderMorton::BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>>,embree::FastAllocator::CachedAllocator,embree::BVHN<4>::CreateAlloc,embree::AABBNode_t<embree::NodeRefPtr<4>,4>::Create,embree::sse2::SetBVHNBounds<4>,embree::sse2::CreateMortonLeaf<4,embree::InstancePrimitive>,embree::sse2::CalculateMeshBounds<embree::Instance>,embree::Scene::BuildProgressMonitorInterface>::recreateMortonCodes(embree::range<unsigned_int>const&)const::_lambda(embree::range<unsigned_int>const&)_2_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_int>const&)_1_>
              (&local_108,&local_110,&context);
    cVar34 = tbb::detail::r1::is_group_execution_cancelled(&context);
    if (cVar34 == '\0') {
      tbb::detail::d1::task_group_context::~task_group_context(&context);
      tbb::detail::d1::parallel_sort<embree::sse2::BVHBuilderMorton::BuildPrim*>
                (this->morton + current->_begin,this->morton + current->_end);
      return;
    }
    prVar35 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar35,"task cancelled");
    __cxa_throw(prVar35,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar35 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar35,"task cancelled");
  __cxa_throw(prVar35,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

__noinline void recreateMortonCodes(const range<unsigned>& current) const
        {
          /* fast path for small ranges */
          if (likely(current.size() < 1024))
          {
            /*! recalculate centroid bounds */
            BBox3fa centBounds(empty);
            for (size_t i=current.begin(); i<current.end(); i++)
              centBounds.extend(center2(calculateBounds(morton[i])));

            /* recalculate morton codes */
            MortonCodeMapping mapping(centBounds);
            for (size_t i=current.begin(); i<current.end(); i++)
              morton[i].code = mapping.code(calculateBounds(morton[i]));

            /* sort morton codes */
            std::sort(morton+current.begin(),morton+current.end());
          }
          else
          {
            /*! recalculate centroid bounds */
            auto calculateCentBounds = [&] ( const range<unsigned>& r ) {
              BBox3fa centBounds = empty;
              for (size_t i=r.begin(); i<r.end(); i++)
                centBounds.extend(center2(calculateBounds(morton[i])));
              return centBounds;
            };
            const BBox3fa centBounds = parallel_reduce(current.begin(), current.end(), unsigned(1024),
                                                       BBox3fa(empty), calculateCentBounds, BBox3fa::merge);

            /* recalculate morton codes */
            MortonCodeMapping mapping(centBounds);
            parallel_for(current.begin(), current.end(), unsigned(1024), [&] ( const range<unsigned>& r ) {
                for (size_t i=r.begin(); i<r.end(); i++) {
                  morton[i].code = mapping.code(calculateBounds(morton[i]));
                }
              });

            /*! sort morton codes */
#if defined(TASKING_TBB)
            tbb::parallel_sort(morton+current.begin(),morton+current.end());
#else
            radixsort32(morton+current.begin(),current.size());
#endif
          }
        }